

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O1

client * workspace_list_find_window_client(workspace_list *list,xcb_window_t window)

{
  size_t sVar1;
  workspace **ppwVar2;
  client *pcVar3;
  size_t sVar4;
  
  sVar1 = list->count;
  if (sVar1 != 0) {
    ppwVar2 = list->workspaces;
    sVar4 = 0;
    do {
      pcVar3 = workspace_find_window_client(ppwVar2[sVar4],window);
      if (pcVar3 != (client *)0x0) {
        return pcVar3;
      }
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return (client *)0x0;
}

Assistant:

struct client *workspace_list_find_window_client(const struct workspace_list *list,
                                                 xcb_window_t window)
{
        for (size_t i = 0; i < list->count; ++i) {
                struct workspace *workspace = list->workspaces[i];
                struct client *client = workspace_find_window_client(workspace, window);

                if (client != NULL) {
                        return client;
                }
        }

        return NULL;
}